

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

StringUtil * __thiscall
cfd::core::StringUtil::Join
          (StringUtil *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *str_list,string *separate_word)

{
  char *__c;
  ulong uVar1;
  char_type *pcVar2;
  size_t sVar3;
  long lVar4;
  undefined1 local_1e8 [32];
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  local_1c8;
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  *local_1b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream_type local_198 [376];
  string *local_20;
  string *separate_word_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *str_list_local;
  string *result;
  
  local_20 = separate_word;
  separate_word_local = (string *)str_list;
  str_list_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  local_1b0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)separate_word_local);
  local_1b8 = (ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
               *)std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)separate_word_local);
  __c = (char *)::std::__cxx11::string::c_str();
  std::
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  ::ostream_iterator(&local_1c8,local_198,__c);
  ::std::
  copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
             local_1b0,local_1b8);
  ::std::__cxx11::stringstream::str();
  uVar1 = ::std::__cxx11::string::size();
  pcVar2 = (char_type *)::std::__cxx11::string::c_str();
  sVar3 = ::std::char_traits<char>::length(pcVar2);
  if (sVar3 <= uVar1) {
    lVar4 = ::std::__cxx11::string::size();
    pcVar2 = (char_type *)::std::__cxx11::string::c_str();
    sVar3 = ::std::char_traits<char>::length(pcVar2);
    ::std::__cxx11::string::erase((ulong)this,lVar4 - sVar3);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string StringUtil::Join(
    const std::vector<std::string> &str_list,
    const std::string &separate_word) {
  std::stringstream ss;
  std::copy(
      str_list.begin(), str_list.end(),
      std::ostream_iterator<std::string>(ss, separate_word.c_str()));
  std::string result = ss.str();

  if (result.size() < std::char_traits<char>::length(separate_word.c_str()))
    return result;

  result.erase(
      result.size() - std::char_traits<char>::length(separate_word.c_str()));
  return result;
}